

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

bool __thiscall QSidebar::event(QSidebar *this,QEvent *event)

{
  Type TVar1;
  int iVar2;
  QEvent *in_RSI;
  QEvent *in_RDI;
  QKeyEvent *ke;
  QEvent *in_stack_ffffffffffffffe0;
  bool local_1;
  
  TVar1 = QEvent::type(in_RSI);
  if ((TVar1 == KeyRelease) &&
     (iVar2 = QKeyEvent::key((QKeyEvent *)in_RSI), in_stack_ffffffffffffffe0 = in_RSI,
     iVar2 == 0x1000007)) {
    removeEntry((QSidebar *)event);
    local_1 = true;
  }
  else {
    local_1 = QListView::event((QListView *)in_stack_ffffffffffffffe0,in_RDI);
  }
  return local_1;
}

Assistant:

bool QSidebar::event(QEvent * event)
{
    if (event->type() == QEvent::KeyRelease) {
        QKeyEvent *ke = static_cast<QKeyEvent *>(event);
        if (ke->key() == Qt::Key_Delete) {
            removeEntry();
            return true;
        }
    }
    return QListView::event(event);
}